

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_conjunctive.cpp
# Opt level: O3

void __thiscall ColValCondDAGNode::~ColValCondDAGNode(ColValCondDAGNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->left_col_name_)._M_dataplus._M_p;
  paVar1 = &(this->left_col_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

~ColValCondDAGNode() final {
    }